

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtRaycastCallback.cpp
# Opt level: O3

void __thiscall
cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
          (cbtTriangleConvexcastCallback *this,cbtConvexShape *convexShape,
          cbtTransform *convexShapeFrom,cbtTransform *convexShapeTo,cbtTransform *triangleToWorld,
          cbtScalar triangleCollisionMargin)

{
  undefined8 uVar1;
  
  (this->super_cbtTriangleCallback)._vptr_cbtTriangleCallback =
       (_func_int **)&PTR__cbtTriangleCallback_00b4bbc0;
  this->m_convexShape = convexShape;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexShapeFrom->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeFrom->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexShapeFrom).m_origin.m_floats =
       *(undefined8 *)(convexShapeFrom->m_origin).m_floats;
  *(undefined8 *)((this->m_convexShapeFrom).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexShapeTo->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexShapeTo->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexShapeTo).m_origin.m_floats =
       *(undefined8 *)(convexShapeTo->m_origin).m_floats;
  *(undefined8 *)((this->m_convexShapeTo).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[0].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[1].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_basis.m_el[2].m_floats =
       *(undefined8 *)(triangleToWorld->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((triangleToWorld->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_triangleToWorld).m_origin.m_floats =
       *(undefined8 *)(triangleToWorld->m_origin).m_floats;
  *(undefined8 *)((this->m_triangleToWorld).m_origin.m_floats + 2) = uVar1;
  this->m_hitFraction = 1.0;
  this->m_triangleCollisionMargin = triangleCollisionMargin;
  this->m_allowedPenetration = 0.0;
  return;
}

Assistant:

cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback(const cbtConvexShape* convexShape, const cbtTransform& convexShapeFrom, const cbtTransform& convexShapeTo, const cbtTransform& triangleToWorld, const cbtScalar triangleCollisionMargin)
{
	m_convexShape = convexShape;
	m_convexShapeFrom = convexShapeFrom;
	m_convexShapeTo = convexShapeTo;
	m_triangleToWorld = triangleToWorld;
	m_hitFraction = 1.0f;
	m_triangleCollisionMargin = triangleCollisionMargin;
	m_allowedPenetration = 0.f;
}